

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O0

token * dup_token(dmr_C *C,token *token,position *streampos)

{
  token *ptVar1;
  token *alloc;
  position *streampos_local;
  token *token_local;
  dmr_C *C_local;
  
  ptVar1 = alloc_token(C,streampos);
  ptVar1->pos = (position)
                ((ulong)ptVar1->pos & 0xffffffffffffffc0 | (ulong)(SUB84(token->pos,0) & 0x3f));
  ptVar1->pos = (position)
                ((ulong)ptVar1->pos & 0xffffffffffefffff |
                (ulong)((uint)((ulong)token->pos >> 0x14) & 1) << 0x14);
  ptVar1->pos = (position)
                ((ulong)ptVar1->pos & 0xffffffffffdfffff |
                (ulong)((uint)((ulong)token->pos >> 0x15) & 1) << 0x15);
  ptVar1->field_2 = token->field_2;
  ptVar1->pos = (position)
                ((ulong)ptVar1->pos & 0x7fffffffffffffff | (ulong)token->pos & 0x8000000000000000);
  return ptVar1;
}

Assistant:

static struct token *dup_token(struct dmr_C *C, struct token *token, struct position *streampos)
{
	struct token *alloc = alloc_token(C, streampos);
	dmrC_token_type(alloc) = dmrC_token_type(token);
	alloc->pos.newline = token->pos.newline;
	alloc->pos.whitespace = token->pos.whitespace;
	alloc->number = token->number;
	alloc->pos.noexpand = token->pos.noexpand;
	return alloc;	
}